

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveExpression.h
# Opt level: O2

ptr<Value> __thiscall
PrimitiveExpression<Double>::evaluate(PrimitiveExpression<Double> *this,Environment *env)

{
  double dVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Value> pVar2;
  Double local_18;
  
  std::make_shared<Double,Double&>(&local_18);
  dVar1 = local_18.value;
  local_18.value = 0.0;
  (this->super_Expression)._vptr_Expression =
       (_func_int **)local_18.super_Value.super_Member._vptr_Member;
  (this->value).super_Value.super_Member._vptr_Member = (_func_int **)dVar1;
  local_18.super_Value.super_Member._vptr_Member = (Member)(_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_18.value);
  pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> evaluate(Environment *env) override {
        return make<T>(value);
    }